

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFVB
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Vector *this_00;
  float fVar8;
  float fVar9;
  TMATRIX IR2Matrix;
  TMATRIX R2Matrix;
  undefined1 local_e8 [16];
  KFLOAT64 KStack_d8;
  KFLOAT64 local_d0;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> local_c0;
  Vector local_98;
  Vector local_70;
  WorldCoordinates local_58;
  float local_38;
  
  calcDeadReckoningFPB(this,PositionOut,totalTimeSinceReset);
  fVar1 = (float)this->m_f64Magnitude;
  fVar8 = fVar1 * (float)totalTimeSinceReset;
  __x = (double)fVar8;
  if (__x <= 1e-05) {
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              ((Vector *)local_e8,&this->m_initOrientationMatrixTranspose,&this->m_Ab);
    DATA_TYPE::Vector::operator*(&local_98,(Vector *)local_e8,totalTimeSinceReset);
    DATA_TYPE::WorldCoordinates::operator+(&local_58,PositionOut,&local_98);
    PositionOut->m_f64Z = local_58.m_f64Z;
    PositionOut->m_f64X = local_58.m_f64X;
    PositionOut->m_f64Y = local_58.m_f64Y;
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_98.super_DataTypeBase);
    this_00 = (Vector *)local_e8;
  }
  else {
    fVar9 = fVar1 * fVar1 * fVar1;
    dVar2 = cos(__x);
    dVar3 = sin(__x);
    dVar4 = cos(__x);
    dVar5 = sin(__x);
    dVar6 = sin(__x);
    dVar7 = cos(__x);
    local_38 = (this->m_wwMatrix).Data[2][2];
    local_58.super_DataTypeBase._vptr_DataTypeBase = *(_func_int ***)(this->m_wwMatrix).Data[0];
    local_58.m_f64X = *(KFLOAT64 *)((this->m_wwMatrix).Data[0] + 2);
    local_58.m_f64Y = *(KFLOAT64 *)((this->m_wwMatrix).Data[1] + 1);
    local_58.m_f64Z = *(KFLOAT64 *)(this->m_wwMatrix).Data[2];
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_98);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              ((Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&local_58,
               ((((double)(fVar8 * fVar8) * 0.5 - dVar2) - dVar3 * __x) + 1.0) /
               (double)(fVar1 * fVar9));
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              ((Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&local_98,
               (dVar5 * __x + dVar4 + -1.0) / (double)(fVar1 * fVar1));
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*
              (&local_c0,(Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&this->m_SkewOmegaMatrix
               ,(dVar6 - dVar7 * __x) / (double)fVar9);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_e8,
               (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_98,&local_c0);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_58,
               (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_e8);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_70,(Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)&local_58,
               &this->m_Ab);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              ((Vector *)&local_c0,&this->m_initOrientationMatrixTranspose,&local_70);
    DATA_TYPE::WorldCoordinates::operator+
              ((WorldCoordinates *)local_e8,PositionOut,(Vector *)&local_c0);
    PositionOut->m_f64Z = local_d0;
    PositionOut->m_f64X = (KFLOAT64)local_e8._8_8_;
    PositionOut->m_f64Y = KStack_d8;
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)local_e8);
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&local_c0);
    this_00 = &local_70;
  }
  DATA_TYPE::DataTypeBase::~DataTypeBase(&this_00->super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFVB( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    // the first part of the equation
    calcDeadReckoningFPB( PositionOut, totalTimeSinceReset);

    // now adding to the position R0t_w->b * R2 * Ab
    // Calculate Magnitude, scalars etc
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;

    if( f64DeltaMag > MAGIC_EPSILON )
    {

        KFLOAT32 m_f32MagPow2 = m_f64Magnitude * m_f64Magnitude;
        KFLOAT32 m_f32MagPow3 = m_f32MagPow2 * m_f64Magnitude;
        KFLOAT32 m_f32MagPow4 = m_f32MagPow3 * m_f64Magnitude;
        KFLOAT32 m_f32DeltaPow2 = f64DeltaMag * f64DeltaMag;

        KFLOAT64 f64R2Scale = (0.5 * m_f32DeltaPow2 - cos( f64DeltaMag )- f64DeltaMag * sin( f64DeltaMag ) + 1)/m_f32MagPow4;

        KFLOAT64 f64R2IScalar = ( cos( f64DeltaMag ) + f64DeltaMag * sin( f64DeltaMag ) - 1.0 ) / m_f32MagPow2;

        KFLOAT64 f64R2SkewScale = ( sin( f64DeltaMag ) - f64DeltaMag * cos( f64DeltaMag ) ) / m_f32MagPow3;

        // Create the ww matrix
        TMATRIX R2Matrix( m_wwMatrix ), IR2Matrix;
        R2Matrix *= f64R2Scale;
        IR2Matrix *= f64R2IScalar;
        R2Matrix += ( IR2Matrix + ( m_SkewOmegaMatrix * f64R2SkewScale ) );

        PositionOut = PositionOut + ( m_initOrientationMatrixTranspose * ( R2Matrix * m_Ab ) );
    } else
        PositionOut = PositionOut + ( m_initOrientationMatrixTranspose * m_Ab ) * totalTimeSinceReset;
}